

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddFind.c
# Opt level: O2

DdNode * addDoIthBit(DdManager *dd,DdNode *f,DdNode *index)

{
  int *piVar1;
  DdHalfWord index_00;
  DdNode *pDVar2;
  DdNode *T;
  DdNode *data;
  
  if (f->index == 0x7fffffff) {
    pDVar2 = (&dd->one)[((uint)(int)(f->type).value >> ((int)(index->type).value & 0x1fU) & 1) == 0]
    ;
  }
  else {
    pDVar2 = cuddCacheLookup2(dd,addDoIthBit,f,index);
    if (pDVar2 == (DdNode *)0x0) {
      index_00 = f->index;
      pDVar2 = (f->type).kids.E;
      T = addDoIthBit(dd,(f->type).kids.T,index);
      if (T != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar2 = addDoIthBit(dd,pDVar2,index);
        if (pDVar2 != (DdNode *)0x0) {
          piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
          *piVar1 = *piVar1 + 1;
          data = T;
          if ((T == pDVar2) || (data = cuddUniqueInter(dd,index_00,T,pDVar2), data != (DdNode *)0x0)
             ) {
            piVar1 = (int *)(((ulong)T & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
            *piVar1 = *piVar1 + -1;
            cuddCacheInsert2(dd,addDoIthBit,f,index,data);
            return data;
          }
          Cudd_RecursiveDeref(dd,T);
          T = pDVar2;
        }
        Cudd_RecursiveDeref(dd,T);
      }
      pDVar2 = (DdNode *)0x0;
    }
  }
  return pDVar2;
}

Assistant:

static DdNode *
addDoIthBit(
  DdManager * dd,
  DdNode * f,
  DdNode * index)
{
    DdNode *res, *T, *E;
    DdNode *fv, *fvn;
    int mask, value;
    int v;

    statLine(dd);
    /* Check terminal case. */
    if (cuddIsConstant(f)) {
        mask = 1 << ((int) cuddV(index));
        value = (int) cuddV(f);
        return((value & mask) == 0 ? DD_ZERO(dd) : DD_ONE(dd));
    }

    /* Check cache. */
    res = cuddCacheLookup2(dd,addDoIthBit,f,index);
    if (res != NULL) return(res);

    /* Recursive step. */
    v = f->index;
    fv = cuddT(f); fvn = cuddE(f);

    T = addDoIthBit(dd,fv,index);
    if (T == NULL) return(NULL);
    cuddRef(T);

    E = addDoIthBit(dd,fvn,index);
    if (E == NULL) {
        Cudd_RecursiveDeref(dd, T);
        return(NULL);
    }
    cuddRef(E);

    res = (T == E) ? T : cuddUniqueInter(dd,v,T,E);
    if (res == NULL) {
        Cudd_RecursiveDeref(dd, T);
        Cudd_RecursiveDeref(dd, E);
        return(NULL);
    }
    cuddDeref(T);
    cuddDeref(E);

    /* Store result. */
    cuddCacheInsert2(dd,addDoIthBit,f,index,res);

    return(res);

}